

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleListDecoder.h
# Opt level: O2

void __thiscall
o3dgc::TriangleListDecoder<unsigned_short>::TriangleListDecoder
          (TriangleListDecoder<unsigned_short> *this)

{
  AdjacencyInfo::AdjacencyInfo(&this->m_vertexToTriangle,0x10,0x10);
  memset(&this->m_ctfans,0,0xa4);
  TriangleFans::TriangleFans(&this->m_tfans,8,0x80);
  this->m_decodeTrianglesOrder = false;
  this->m_decodeVerticesOrder = false;
  memset(this,0,0x90);
  return;
}

Assistant:

TriangleListDecoder(void)
                                    {
                                        m_vertexCount            = 0;
                                        m_triangleCount          = 0;
                                        m_numTriangles           = 0;
                                        m_numVertices            = 0;
                                        m_triangles              = 0;
                                        m_numConqueredTriangles  = 0;
                                        m_numVisitedVertices     = 0;
                                        m_visitedVertices        = 0;
                                        m_visitedVerticesValence = 0;
                                        m_maxNumVertices         = 0;
                                        m_maxNumTriangles        = 0;
                                        m_itNumTFans             = 0;
                                        m_itDegree               = 0;
                                        m_itConfig               = 0;
                                        m_itOperation            = 0;
                                        m_itIndex                = 0;
                                        m_tempTriangles          = 0;
                                        m_tempTrianglesSize      = 0;
                                        m_decodeTrianglesOrder   = false;
                                        m_decodeVerticesOrder    = false;
                                    }